

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  size_t __n;
  size_t size;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  basic_buffer<char> *c;
  ulong uVar9;
  char __tmp;
  size_t __len;
  size_t __n_00;
  
  uVar5 = (ulong)spec->width_;
  uVar8 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n_00 = uVar5 - uVar8;
  if (uVar5 < uVar8 || __n_00 == 0) {
    uVar8 = uVar8 + lVar3;
    if ((ulong)puVar2[3] < uVar8) {
      (**(code **)*puVar2)(puVar2,uVar8);
    }
    puVar2[2] = uVar8;
    __n = f->size_;
    if (__n != 0) {
      pvVar7 = (void *)(lVar3 + puVar2[1]);
LAB_0013b028:
      memmove(pvVar7,f->s,__n);
      return;
    }
  }
  else {
    uVar9 = lVar3 + uVar5;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    pvVar6 = (void *)(lVar3 + puVar2[1]);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar9 = __n_00 >> 1;
      pvVar7 = pvVar6;
      if (1 < __n_00) {
        pvVar7 = (void *)((long)pvVar6 + uVar9);
        memset(pvVar6,(uint)bVar1,uVar9);
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        memmove(pvVar7,f->s,sVar4);
      }
      if (uVar5 != uVar8) {
        __n_00 = __n_00 - uVar9;
        pvVar6 = (void *)((long)pvVar7 + sVar4);
LAB_0013b0bf:
        memset(pvVar6,(uint)bVar1,__n_00);
        return;
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar7 = pvVar6;
      if (uVar5 != uVar8) {
        pvVar7 = (void *)((long)pvVar6 + __n_00);
        memset(pvVar6,(uint)bVar1,__n_00);
      }
      __n = f->size_;
      if (__n != 0) goto LAB_0013b028;
    }
    else {
      sVar4 = f->size_;
      if (sVar4 != 0) {
        memmove(pvVar6,f->s,sVar4);
      }
      if (uVar5 != uVar8) {
        pvVar6 = (void *)((long)pvVar6 + sVar4);
        goto LAB_0013b0bf;
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }